

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

Var Js::JavascriptOperators::OP_LoadModuleRoot(int moduleID,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JavascriptLibrary *this;
  ModuleRoot *moduleRoot;
  ScriptContext *scriptContext_local;
  ModuleRoot *pMStack_10;
  int moduleID_local;
  
  pMStack_10 = GetModuleRoot(moduleID,scriptContext);
  if (pMStack_10 == (ModuleRoot *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x1b3b,"(false)","false");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
    this = ScriptContext::GetLibrary(scriptContext);
    pMStack_10 = (ModuleRoot *)
                 JavascriptLibraryBase::GetUndefined(&this->super_JavascriptLibraryBase);
  }
  return pMStack_10;
}

Assistant:

Var JavascriptOperators::OP_LoadModuleRoot(int moduleID, ScriptContext* scriptContext)
    {
        Js::ModuleRoot * moduleRoot = GetModuleRoot(moduleID, scriptContext);
        if (moduleRoot)
        {
            return moduleRoot;
        }
        Assert(false);
        return scriptContext->GetLibrary()->GetUndefined();
    }